

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGenericHandler.cxx
# Opt level: O1

cmValue __thiscall cmCTestGenericHandler::GetOption(cmCTestGenericHandler *this,string *op)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->Options)._M_t,op);
  p_Var2 = (_Base_ptr)0x0;
  if ((_Rb_tree_header *)iVar1._M_node != &(this->Options)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = iVar1._M_node + 2;
  }
  return (cmValue)(string *)p_Var2;
}

Assistant:

cmValue cmCTestGenericHandler::GetOption(const std::string& op)
{
  auto remit = this->Options.find(op);
  if (remit == this->Options.end()) {
    return nullptr;
  }
  return cmValue(remit->second);
}